

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

t_symbol * sys_decodedialog(t_symbol *s)

{
  t_symbol *ptVar1;
  int local_404;
  char *pcStack_400;
  int i;
  char *sp;
  char buf [1000];
  t_symbol *s_local;
  
  pcStack_400 = s->s_name;
  buf._992_8_ = s;
  if (*pcStack_400 == '+') {
    pcStack_400 = pcStack_400 + 1;
  }
  else {
    bug("sys_decodedialog: %s",pcStack_400);
  }
  local_404 = 0;
  for (; (local_404 < 999 && (*pcStack_400 != '\0')); pcStack_400 = pcStack_400 + 1) {
    if (*pcStack_400 == '+') {
      if (pcStack_400[1] == '_') {
        buf[(long)local_404 + -8] = ' ';
        pcStack_400 = pcStack_400 + 1;
      }
      else if (pcStack_400[1] == '+') {
        buf[(long)local_404 + -8] = '+';
        pcStack_400 = pcStack_400 + 1;
      }
      else if (pcStack_400[1] == 'c') {
        buf[(long)local_404 + -8] = ',';
        pcStack_400 = pcStack_400 + 1;
      }
      else if (pcStack_400[1] == 's') {
        buf[(long)local_404 + -8] = ';';
        pcStack_400 = pcStack_400 + 1;
      }
      else if (pcStack_400[1] == 'd') {
        buf[(long)local_404 + -8] = '$';
        pcStack_400 = pcStack_400 + 1;
      }
      else {
        buf[(long)local_404 + -8] = *pcStack_400;
      }
    }
    else {
      buf[(long)local_404 + -8] = *pcStack_400;
    }
    local_404 = local_404 + 1;
  }
  buf[(long)local_404 + -8] = '\0';
  ptVar1 = gensym((char *)&sp);
  return ptVar1;
}

Assistant:

t_symbol *sys_decodedialog(t_symbol *s)
{
    char buf[MAXPDSTRING];
    const char *sp = s->s_name;
    int i;
    if (*sp != '+')
        bug("sys_decodedialog: %s", sp);
    else sp++;
    for (i = 0; i < MAXPDSTRING-1; i++, sp++)
    {
        if (!sp[0])
            break;
        if (sp[0] == '+')
        {
            if (sp[1] == '_')
                buf[i] = ' ', sp++;
            else if (sp[1] == '+')
                buf[i] = '+', sp++;
            else if (sp[1] == 'c')
                buf[i] = ',', sp++;
            else if (sp[1] == 's')
                buf[i] = ';', sp++;
            else if (sp[1] == 'd')
                buf[i] = '$', sp++;
            else buf[i] = sp[0];
        }
        else buf[i] = sp[0];
    }
    buf[i] = 0;
    return (gensym(buf));
}